

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O1

void Gia_IsoAssignUnique(Gia_IsoMan_t *p)

{
  int iVar1;
  int Entry;
  Vec_Int_t *t;
  Vec_Int_t *pVVar2;
  ulong uVar3;
  long lVar4;
  
  p->nSingles = 0;
  p->vClasses2->nSize = 0;
  pVVar2 = p->vClasses;
  if (1 < pVVar2->nSize) {
    lVar4 = 1;
    do {
      iVar1 = pVVar2->pArray[lVar4 + -1];
      Entry = pVVar2->pArray[lVar4];
      if (Entry == 1) {
        uVar3 = p->pStoreW[iVar1] >> 0x20;
        if (p->pUniques[uVar3] != 0) {
          __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                        ,0x112,"void Gia_IsoAssignUnique(Gia_IsoMan_t *)");
        }
        iVar1 = p->nUniques;
        p->nUniques = iVar1 + 1;
        p->pUniques[uVar3] = iVar1;
        p->nSingles = p->nSingles + 1;
      }
      else {
        Vec_IntPush(p->vClasses2,iVar1);
        Vec_IntPush(p->vClasses2,Entry);
      }
      pVVar2 = p->vClasses;
      lVar4 = lVar4 + 2;
    } while ((int)lVar4 < pVVar2->nSize);
  }
  p->vClasses = p->vClasses2;
  p->vClasses2 = pVVar2;
  p->nEntries = p->nEntries - p->nSingles;
  return;
}

Assistant:

void Gia_IsoAssignUnique( Gia_IsoMan_t * p )
{
    int i, iBegin, nSize;
    p->nSingles = 0;
    Vec_IntClear( p->vClasses2 );
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        if ( nSize == 1 )
        {
            assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
            p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
            p->nSingles++;
        }
        else
        {
            Vec_IntPush( p->vClasses2, iBegin );
            Vec_IntPush( p->vClasses2, nSize );
        }
    }
    ABC_SWAP( Vec_Int_t *, p->vClasses, p->vClasses2 );
    p->nEntries -= p->nSingles;
}